

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP3Writer::BP3Writer(BP3Writer *this,IO *io,string *name,Mode mode,Comm *comm)

{
  int iVar1;
  undefined8 *in_RDI;
  ScopedTimer __var232;
  Comm *in_stack_ffffffffffffff38;
  BP3Writer *in_stack_ffffffffffffff40;
  IO *in_stack_ffffffffffffff48;
  BP3Serializer *in_stack_ffffffffffffff50;
  TransportMan *this_00;
  Comm *in_stack_ffffffffffffff98;
  Mode in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  IO *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  Engine *in_stack_ffffffffffffffc0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffb8,"BP3",(allocator *)&stack0xffffffffffffffb7);
  helper::Comm::Comm((Comm *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  Engine::Engine(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
  helper::Comm::~Comm((Comm *)0x9fb952);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  *in_RDI = &PTR__BP3Writer_0112dc48;
  adios2::format::BP3Serializer::BP3Serializer
            (in_stack_ffffffffffffff50,(Comm *)in_stack_ffffffffffffff48);
  this_00 = (TransportMan *)(in_RDI + 0xb4);
  transportman::TransportMan::TransportMan
            (this_00,in_stack_ffffffffffffff48,(Comm *)in_stack_ffffffffffffff40);
  transportman::TransportMan::TransportMan
            (this_00,(IO *)(in_RDI + 0xbe),(Comm *)in_stack_ffffffffffffff40);
  *(undefined1 *)(in_RDI + 200) = 0;
  if (BP3Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)::
      __var32 == '\0') {
    iVar1 = __cxa_guard_acquire(&BP3Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
                                 ::__var32);
    if (iVar1 != 0) {
      BP3Writer::__var32 = (void *)ps_timer_create_("BP3Writer::Open");
      in_stack_ffffffffffffff40 = (BP3Writer *)BP3Writer::__var32;
      __cxa_guard_release(&BP3Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
                           ::__var32);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  *(undefined1 *)(in_RDI[5] + 200) = 0;
  Init(in_stack_ffffffffffffff40);
  *(undefined1 *)(in_RDI + 0x10) = 1;
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_ffffffffffffff40);
  return;
}

Assistant:

BP3Writer::BP3Writer(IO &io, const std::string &name, const Mode mode, helper::Comm comm)
: Engine("BP3", io, name, mode, std::move(comm)), m_BP3Serializer(m_Comm),
  m_FileDataManager(io, m_Comm), m_FileMetadataManager(io, m_Comm)
{
    PERFSTUBS_SCOPED_TIMER("BP3Writer::Open");
    m_IO.m_ReadStreaming = false;
    Init();
    m_IsOpen = true;
}